

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeptData.h
# Opt level: O1

void __thiscall
PeptData::PeptData(PeptData *this,ProtData *proteins,EnzymeType enzyme_type,uint max_miss_cleavage,
                  double min_mass,double max_mass)

{
  vector<char,_std::allocator<char>_> *this_00;
  pointer pPVar1;
  pointer pPVar2;
  Protein *pPVar3;
  __normal_iterator<PPData::Peptide_*,_std::vector<PPData::Peptide,_std::allocator<PPData::Peptide>_>_>
  __seed;
  Peptide *pPVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  char *compact_sequence;
  pointer pPVar8;
  Protein *protein;
  Protein *protein_00;
  char cVar9;
  int iVar10;
  unordered_set<PPData::Peptide,_std::hash<PPData::Peptide>,_std::equal_to<PPData::Peptide>,_std::allocator<PPData::Peptide>_>
  pool;
  undefined1 local_18a;
  undefined1 local_189;
  vector<PPData::Peptide,std::allocator<PPData::Peptide>> *local_188;
  _Temporary_buffer<__gnu_cxx::__normal_iterator<PPData::Peptide_*,_std::vector<PPData::Peptide,_std::allocator<PPData::Peptide>_>_>,_PPData::Peptide>
  local_180;
  unordered_map<char,_double,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_double>_>_>
  *local_168;
  _Hashtable<PPData::Peptide,_PPData::Peptide,_std::allocator<PPData::Peptide>,_std::__detail::_Identity,_std::equal_to<PPData::Peptide>,_std::hash<PPData::Peptide>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_160 [5];
  
  this->enzyme_type_ = enzyme_type;
  this->max_miss_cleavage_ = max_miss_cleavage;
  this->min_mass_ = min_mass;
  this->max_mass_ = max_mass;
  this_00 = &this->compact_sequences_;
  local_188 = (vector<PPData::Peptide,std::allocator<PPData::Peptide>> *)&this->peptides_;
  (this->compact_sequences_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->compact_sequences_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->compact_sequences_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->peptides_).super__Vector_base<PPData::Peptide,_std::allocator<PPData::Peptide>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->peptides_).super__Vector_base<PPData::Peptide,_std::allocator<PPData::Peptide>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->peptides_).super__Vector_base<PPData::Peptide,_std::allocator<PPData::Peptide>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->proton_ = 1.00727;
  this->hydrogen_ = 1.00782;
  this->oxygen_ = 15.99491;
  this->water_ = 18.01055;
  memcpy(local_160,&DAT_0013e460,0x130);
  std::
  _Hashtable<char,std::pair<char_const,double>,std::allocator<std::pair<char_const,double>>,std::__detail::_Select1st,std::equal_to<char>,std::hash<char>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_Hashtable<std::pair<char_const,double>const*>
            ((_Hashtable<char,std::pair<char_const,double>,std::allocator<std::pair<char_const,double>>,std::__detail::_Select1st,std::equal_to<char>,std::hash<char>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)&this->mass_table_,local_160,&stack0xffffffffffffffd0,0,&local_180,&local_189,
             &local_18a);
  pPVar1 = (proteins->proteins_).
           super__Vector_base<PPData::Protein,_std::allocator<PPData::Protein>_>._M_impl.
           super__Vector_impl_data._M_start;
  pPVar2 = (proteins->proteins_).
           super__Vector_base<PPData::Protein,_std::allocator<PPData::Protein>_>._M_impl.
           super__Vector_impl_data._M_finish;
  uVar6 = 0;
  pPVar8 = pPVar1;
  if (pPVar1 != pPVar2) {
    do {
      uVar5 = (int)uVar6 + (int)pPVar8->sequence_length;
      uVar6 = (ulong)uVar5;
      pPVar8 = pPVar8 + 1;
    } while (pPVar8 != pPVar2);
    uVar6 = (ulong)(int)uVar5;
  }
  local_168 = &this->mass_table_;
  std::vector<char,_std::allocator<char>_>::resize
            (this_00,((long)pPVar2 - (long)pPVar1 >> 3) * -0x5555555555555555 + uVar6);
  local_160[0]._M_buckets = &local_160[0]._M_single_bucket;
  local_160[0]._M_bucket_count = 1;
  local_160[0]._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_160[0]._M_element_count = 0;
  local_160[0]._M_rehash_policy._M_max_load_factor = 1.0;
  local_160[0]._M_rehash_policy._M_next_resize = 0;
  local_160[0]._M_single_bucket = (__node_base_ptr)0x0;
  protein_00 = (proteins->proteins_).
               super__Vector_base<PPData::Protein,_std::allocator<PPData::Protein>_>._M_impl.
               super__Vector_impl_data._M_start;
  pPVar3 = (proteins->proteins_).
           super__Vector_base<PPData::Protein,_std::allocator<PPData::Protein>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (protein_00 != pPVar3) {
    iVar10 = 0;
    do {
      lVar7 = (long)iVar10;
      compact_sequence =
           (this_00->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
           super__Vector_impl_data._M_start + lVar7;
      if (protein_00->sequence_length != 0) {
        uVar5 = 1;
        uVar6 = 0;
        do {
          cVar9 = 'L';
          if (protein_00->sequence[uVar6] != 'I') {
            cVar9 = protein_00->sequence[uVar6];
          }
          (this_00->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data
          ._M_start[lVar7] = cVar9;
          lVar7 = lVar7 + 1;
          uVar6 = (ulong)uVar5;
          uVar5 = uVar5 + 1;
        } while (uVar6 < protein_00->sequence_length);
        iVar10 = (int)lVar7;
      }
      (this->compact_sequences_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_start[iVar10] = '\0';
      Digest(this,(unordered_set<PPData::Peptide,_std::hash<PPData::Peptide>,_std::equal_to<PPData::Peptide>,_std::allocator<PPData::Peptide>_>
                   *)local_160,protein_00,compact_sequence);
      iVar10 = iVar10 + 1;
      protein_00 = protein_00 + 1;
    } while (protein_00 != pPVar3);
  }
  std::vector<PPData::Peptide,std::allocator<PPData::Peptide>>::
  _M_range_insert<std::__detail::_Node_iterator<PPData::Peptide,true,true>>
            (local_188,
             (this->peptides_).super__Vector_base<PPData::Peptide,_std::allocator<PPData::Peptide>_>
             ._M_impl.super__Vector_impl_data._M_finish,local_160[0]._M_before_begin._M_nxt,0);
  __seed._M_current =
       (this->peptides_).super__Vector_base<PPData::Peptide,_std::allocator<PPData::Peptide>_>.
       _M_impl.super__Vector_impl_data._M_start;
  pPVar4 = (this->peptides_).super__Vector_base<PPData::Peptide,_std::allocator<PPData::Peptide>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (__seed._M_current != pPVar4) {
    lVar7 = ((long)pPVar4 - (long)__seed._M_current >> 4) * -0x5555555555555555;
    std::
    _Temporary_buffer<__gnu_cxx::__normal_iterator<PPData::Peptide_*,_std::vector<PPData::Peptide,_std::allocator<PPData::Peptide>_>_>,_PPData::Peptide>
    ::_Temporary_buffer(&local_180,__seed,(lVar7 - (lVar7 + 1 >> 0x3f)) + 1 >> 1);
    if (local_180._M_buffer == (pointer)0x0) {
      std::
      __inplace_stable_sort<__gnu_cxx::__normal_iterator<PPData::Peptide*,std::vector<PPData::Peptide,std::allocator<PPData::Peptide>>>,__gnu_cxx::__ops::_Iter_comp_iter<PeptData::PeptData(ProtData_const&,PPData::EnzymeType,unsigned_int,double,double)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                (__seed._M_current,pPVar4);
    }
    else {
      std::
      __stable_sort_adaptive<__gnu_cxx::__normal_iterator<PPData::Peptide*,std::vector<PPData::Peptide,std::allocator<PPData::Peptide>>>,PPData::Peptide*,long,__gnu_cxx::__ops::_Iter_comp_iter<PeptData::PeptData(ProtData_const&,PPData::EnzymeType,unsigned_int,double,double)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                (__seed._M_current,pPVar4,local_180._M_buffer,local_180._M_len);
    }
    operator_delete(local_180._M_buffer,local_180._M_len * 0x30);
  }
  std::
  _Hashtable<PPData::Peptide,_PPData::Peptide,_std::allocator<PPData::Peptide>,_std::__detail::_Identity,_std::equal_to<PPData::Peptide>,_std::hash<PPData::Peptide>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(local_160);
  return;
}

Assistant:

PeptData(const ProtData& proteins, EnzymeType enzyme_type, unsigned max_miss_cleavage,
             double min_mass, double max_mass)
            : enzyme_type_(enzyme_type), max_miss_cleavage_(max_miss_cleavage),
              min_mass_(min_mass), max_mass_(max_mass) {
        // calculate compact size
        auto sequences_len_sum = std::accumulate(proteins.begin(), proteins.end(), 0,
            [](const int& sum, const Protein& protein) {
                return sum + protein.sequence_length;
            }
        );
        auto compact_size = sequences_len_sum + proteins.size();  // append '\0' at the end of each sequence
        compact_sequences_.resize(compact_size);

        // build compact sequences and peptides
        std::unordered_set<Peptide> pool;
        int index = 0;
        for (auto& protein : proteins) {
            // fill compact sequence
            const char* compact_sequence = &compact_sequences_[index];
            for (unsigned i = 0; i < protein.sequence_length; ++i) {
                compact_sequences_[index++] = protein.sequence[i] == 'I' ? 'L' : protein.sequence[i];
            }  // prefer L
            compact_sequences_[index++] = '\0';

            // digest and build peptides into pool
            Digest(pool, protein, compact_sequence);
        }

        peptides_.insert(peptides_.end(), pool.begin(), pool.end());
        std::stable_sort(peptides_.begin(), peptides_.end(),
                  [](const auto& one, const auto& another) { return one.mass < another.mass; });
    }